

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfbcursor.cpp
# Opt level: O0

QRect __thiscall QFbCursor::getCurrentRect(QFbCursor *this)

{
  long lVar1;
  QPlatformCursorImage *this_00;
  long in_RDI;
  QPlatformCursorImage *this_01;
  long in_FS_OFFSET;
  QRect QVar2;
  QPoint mScreenOffset;
  QRect rect;
  QRect *in_stack_ffffffffffffff68;
  long lVar3;
  QRect *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QPlatformCursorImage *)(in_RDI + 0x48);
  lVar3 = in_RDI;
  this_00 = QScopedPointer<QPlatformCursorImage,_QScopedPointerDeleter<QPlatformCursorImage>_>::
            operator->((QScopedPointer<QPlatformCursorImage,_QScopedPointerDeleter<QPlatformCursorImage>_>
                        *)this_01);
  QPlatformCursorImage::image(this_00);
  QImage::rect();
  QScopedPointer<QPlatformCursorImage,_QScopedPointerDeleter<QPlatformCursorImage>_>::operator->
            ((QScopedPointer<QPlatformCursorImage,_QScopedPointerDeleter<QPlatformCursorImage>_> *)
             this_01);
  QPlatformCursorImage::hotspot(this_01);
  QPoint::x((QPoint *)0x11ffe3);
  QScopedPointer<QPlatformCursorImage,_QScopedPointerDeleter<QPlatformCursorImage>_>::operator->
            ((QScopedPointer<QPlatformCursorImage,_QScopedPointerDeleter<QPlatformCursorImage>_> *)
             this_01);
  QPlatformCursorImage::hotspot(this_01);
  QPoint::y((QPoint *)0x12000a);
  QVar2 = QRect::translated(in_stack_ffffffffffffffa8,(int)((ulong)lVar3 >> 0x20),(int)lVar3);
  QRect::translate((QRect *)this_01,(QPoint *)in_stack_ffffffffffffff68);
  (**(code **)(**(long **)(in_RDI + 0x18) + 0x68))();
  QRect::topLeft(in_stack_ffffffffffffff68);
  operator-((QPoint *)this_01);
  QRect::translate((QRect *)this_01,(QPoint *)in_stack_ffffffffffffff68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QRect QFbCursor::getCurrentRect() const
{
    QRect rect = mCursorImage->image()->rect().translated(-mCursorImage->hotspot().x(),
                                                          -mCursorImage->hotspot().y());
    rect.translate(m_pos);
    QPoint mScreenOffset = mScreen->geometry().topLeft();
    rect.translate(-mScreenOffset);  // global to local translation
    return rect;
}